

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

void HighsHashTree<int,_int>::erase_recurse(NodePtr *erase_node,uint64_t hash,int hashPos,int *key)

{
  uint8_t uVar1;
  bool bVar2;
  Type TVar3;
  int iVar4;
  int iVar5;
  ListLeaf *pLVar6;
  int *piVar7;
  InnerLeaf<1> *ptr;
  InnerLeaf<2> *ptr_00;
  InnerLeaf<3> *this;
  BranchNode *this_00;
  NodePtr NVar8;
  int *in_RCX;
  int in_EDX;
  NodePtr *in_RSI;
  NodePtr *in_RDI;
  int location;
  BranchNode *branch;
  InnerLeaf<3> *newLeaf_2;
  InnerLeaf<4> *leaf_4;
  InnerLeaf<2> *newLeaf_1;
  InnerLeaf<3> *leaf_3;
  InnerLeaf<1> *newLeaf;
  InnerLeaf<2> *leaf_2;
  InnerLeaf<1> *leaf_1;
  ListNode *next;
  ListNode *iter;
  ListLeaf *leaf;
  uint8_t in_stack_fffffffffffffebf;
  Occupation *in_stack_fffffffffffffec0;
  InnerLeaf<4> *in_stack_fffffffffffffed8;
  InnerLeaf<2> *in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffeec;
  int iVar9;
  uint64_t in_stack_fffffffffffffef0;
  InnerLeaf<4> *in_stack_fffffffffffffef8;
  NodePtr local_a8;
  InnerLeaf<3> *local_a0;
  InnerLeaf<4> *local_98;
  NodePtr local_90;
  InnerLeaf<2> *local_88;
  InnerLeaf<3> *local_80;
  NodePtr local_78 [3];
  InnerLeaf<1> *local_60;
  InnerLeaf<2> *local_58;
  NodePtr local_50;
  InnerLeaf<1> *local_48;
  undefined4 local_40;
  int in_stack_ffffffffffffffc4;
  uint64_t in_stack_ffffffffffffffc8;
  ListLeaf *pLVar10;
  undefined8 in_stack_ffffffffffffffd0;
  ListLeaf *pLVar11;
  BranchNode *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  
  iVar9 = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  TVar3 = NodePtr::getType(in_RDI);
  switch(TVar3) {
  case kEmpty:
    break;
  case kListLeaf:
    pLVar6 = NodePtr::getListLeaf(in_RDI);
    pLVar11 = pLVar6;
    do {
      pLVar10 = (ListLeaf *)(pLVar11->first).next;
      piVar7 = HighsHashTableEntry<int,_int>::key(&(pLVar11->first).entry);
      if (*piVar7 == *in_RCX) {
        pLVar6->count = pLVar6->count + -1;
        if (pLVar10 != (ListLeaf *)0x0) {
          (pLVar11->first).next = (pLVar10->first).next;
          (pLVar11->first).entry = (pLVar10->first).entry;
          if (pLVar10 != (ListLeaf *)0x0) {
            operator_delete(pLVar10);
          }
        }
        break;
      }
      pLVar11 = pLVar10;
    } while (pLVar10 != (ListLeaf *)0x0);
    if (pLVar6->count == 0) {
      if (pLVar6 != (ListLeaf *)0x0) {
        operator_delete(pLVar6);
      }
      NodePtr::NodePtr((NodePtr *)&local_40,(nullptr_t)0x0);
      in_RDI->ptrAndType = CONCAT44(in_stack_ffffffffffffffc4,local_40);
    }
    break;
  case kInnerLeafSizeClass1:
    local_48 = NodePtr::getInnerLeafSizeClass1(in_RDI);
    bVar2 = InnerLeaf<1>::erase_entry
                      ((InnerLeaf<1> *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                       in_stack_fffffffffffffeec,(int *)in_stack_fffffffffffffee0);
    if ((bVar2) && (local_48->size == 0)) {
      if (local_48 != (InnerLeaf<1> *)0x0) {
        operator_delete(local_48);
      }
      NodePtr::NodePtr(&local_50,(nullptr_t)0x0);
      in_RDI->ptrAndType = local_50.ptrAndType;
    }
    break;
  case kInnerLeafSizeClass2:
    local_58 = NodePtr::getInnerLeafSizeClass2(in_RDI);
    bVar2 = InnerLeaf<2>::erase_entry
                      ((InnerLeaf<2> *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                       in_stack_fffffffffffffeec,(int *)in_stack_fffffffffffffee0);
    if ((bVar2) && (iVar9 = local_58->size, iVar4 = InnerLeaf<1>::capacity(), iVar9 == iVar4)) {
      ptr = (InnerLeaf<1> *)operator_new(0x78);
      InnerLeaf<1>::InnerLeaf<2>
                ((InnerLeaf<1> *)in_stack_fffffffffffffee0,(InnerLeaf<2> *)in_stack_fffffffffffffed8
                );
      local_60 = ptr;
      NodePtr::NodePtr(local_78,ptr);
      in_RDI->ptrAndType = local_78[0].ptrAndType;
      if (local_58 != (InnerLeaf<2> *)0x0) {
        operator_delete(local_58);
      }
    }
    break;
  case kInnerLeafSizeClass3:
    local_80 = NodePtr::getInnerLeafSizeClass3(in_RDI);
    bVar2 = InnerLeaf<3>::erase_entry
                      ((InnerLeaf<3> *)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                       in_stack_fffffffffffffeec,(int *)in_stack_fffffffffffffee0);
    if ((bVar2) && (iVar9 = local_80->size, iVar4 = InnerLeaf<2>::capacity(), iVar9 == iVar4)) {
      ptr_00 = (InnerLeaf<2> *)operator_new(0x178);
      InnerLeaf<2>::InnerLeaf<3>
                (in_stack_fffffffffffffee0,(InnerLeaf<3> *)in_stack_fffffffffffffed8);
      local_88 = ptr_00;
      NodePtr::NodePtr(&local_90,ptr_00);
      in_RDI->ptrAndType = local_90.ptrAndType;
      if (local_80 != (InnerLeaf<3> *)0x0) {
        operator_delete(local_80);
      }
    }
    break;
  case kInnerLeafSizeClass4:
    local_98 = NodePtr::getInnerLeafSizeClass4(in_RDI);
    bVar2 = InnerLeaf<4>::erase_entry
                      (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec
                       ,(int *)in_stack_fffffffffffffee0);
    if (bVar2) {
      iVar9 = local_98->size;
      iVar4 = InnerLeaf<3>::capacity();
      if (iVar9 == iVar4) {
        this = (InnerLeaf<3> *)operator_new(0x278);
        InnerLeaf<3>::InnerLeaf<4>(this,in_stack_fffffffffffffed8);
        local_a0 = this;
        NodePtr::NodePtr(&local_a8,this);
        in_RDI->ptrAndType = local_a8.ptrAndType;
        if (local_98 != (InnerLeaf<4> *)0x0) {
          operator_delete(local_98);
        }
      }
    }
    break;
  case kBranchNode:
    this_00 = NodePtr::getBranchNode(in_RDI);
    iVar4 = (int)((ulong)in_RCX >> 0x20);
    uVar1 = get_hash_chunk((uint64_t)in_RSI,in_EDX);
    bVar2 = Occupation::test(&this_00->occupation,uVar1);
    if (bVar2) {
      get_hash_chunk((uint64_t)in_RSI,in_EDX);
      iVar5 = Occupation::num_set_until(in_stack_fffffffffffffec0,in_stack_fffffffffffffebf);
      erase_recurse(in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe8),iVar4,
                    (int *)in_stack_ffffffffffffffd8);
      TVar3 = NodePtr::getType(this_00->child + (iVar5 + -1));
      if (TVar3 == kEmpty) {
        uVar1 = get_hash_chunk((uint64_t)in_RSI,in_EDX);
        Occupation::flip(&this_00->occupation,uVar1);
        NVar8 = removeChildFromBranchNode
                          (in_stack_ffffffffffffffd8,iVar9,in_stack_ffffffffffffffc8,
                           in_stack_ffffffffffffffc4);
        in_RDI->ptrAndType = NVar8.ptrAndType;
      }
    }
  }
  return;
}

Assistant:

static void erase_recurse(NodePtr* erase_node, uint64_t hash, int hashPos,
                            const K& key) {
    switch (erase_node->getType()) {
      case kEmpty: {
        return;
      }
      case kListLeaf: {
        ListLeaf* leaf = erase_node->getListLeaf();

        // check for existing key
        ListNode* iter = &leaf->first;

        do {
          ListNode* next = iter->next;
          if (iter->entry.key() == key) {
            // key found, decrease count
            --leaf->count;
            if (next != nullptr) {
              // if we have a next node after replace the entry in iter by
              // moving that node into it
              *iter = std::move(*next);
              // delete memory of that node
              delete next;
            }

            break;
          }

          iter = next;
        } while (iter != nullptr);

        if (leaf->count == 0) {
          delete leaf;
          *erase_node = nullptr;
        }

        return;
      }
      case kInnerLeafSizeClass1: {
        InnerLeaf<1>* leaf = erase_node->getInnerLeafSizeClass1();
        if (leaf->erase_entry(hash, hashPos, key)) {
          if (leaf->size == 0) {
            delete leaf;
            *erase_node = nullptr;
          }
        }

        return;
      }
      case kInnerLeafSizeClass2: {
        InnerLeaf<2>* leaf = erase_node->getInnerLeafSizeClass2();

        if (leaf->erase_entry(hash, hashPos, key)) {
          if (leaf->size == InnerLeaf<1>::capacity()) {
            InnerLeaf<1>* newLeaf = new InnerLeaf<1>(std::move(*leaf));
            *erase_node = newLeaf;
            delete leaf;
          }
        }

        return;
      }
      case kInnerLeafSizeClass3: {
        InnerLeaf<3>* leaf = erase_node->getInnerLeafSizeClass3();

        if (leaf->erase_entry(hash, hashPos, key)) {
          if (leaf->size == InnerLeaf<2>::capacity()) {
            InnerLeaf<2>* newLeaf = new InnerLeaf<2>(std::move(*leaf));
            *erase_node = newLeaf;
            delete leaf;
          }
        }

        return;
      }
      case kInnerLeafSizeClass4: {
        InnerLeaf<4>* leaf = erase_node->getInnerLeafSizeClass4();

        if (leaf->erase_entry(hash, hashPos, key)) {
          if (leaf->size == InnerLeaf<3>::capacity()) {
            InnerLeaf<3>* newLeaf = new InnerLeaf<3>(std::move(*leaf));
            *erase_node = newLeaf;
            delete leaf;
          }
        }

        return;
      }
      case kBranchNode: {
        BranchNode* branch = erase_node->getBranchNode();

        if (!branch->occupation.test(get_hash_chunk(hash, hashPos))) return;

        int location =
            branch->occupation.num_set_until(get_hash_chunk(hash, hashPos)) - 1;
        erase_recurse(&branch->child[location], hash, hashPos + 1, key);

        if (branch->child[location].getType() != kEmpty) return;

        branch->occupation.flip(get_hash_chunk(hash, hashPos));

        *erase_node =
            removeChildFromBranchNode(branch, location, hash, hashPos);
        break;
      }
    }
  }